

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O3

int ws_frame_prep_tx(nni_ws *ws,ws_frame *frame)

{
  nni_aio *aio;
  byte bVar1;
  uint8_t uVar2;
  uint8_t uVar4;
  uint8_t *__dest;
  size_t sVar3;
  _Bool _Var5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  uint local_44;
  nni_ws *pnStack_40;
  uint niov;
  nni_iov *local_38;
  nni_iov *iov;
  
  aio = frame->aio;
  frame->len = 0;
  nni_aio_get_iov(aio,&local_44,&local_38);
  uVar8 = frame->len;
  if ((ulong)local_44 != 0) {
    lVar6 = 0;
    do {
      uVar8 = uVar8 + *(long *)((long)&local_38->iov_len + lVar6);
      lVar6 = lVar6 + 0x10;
    } while ((ulong)local_44 << 4 != lVar6);
    frame->len = uVar8;
  }
  uVar7 = ws->fragsize;
  _Var5 = true;
  if (uVar7 != 0 && uVar7 < uVar8) {
    frame->len = uVar7;
    _Var5 = ws->isstream;
    uVar8 = uVar7;
  }
  frame->final = _Var5;
  pnStack_40 = ws;
  if (frame->asize < uVar8) {
    nni_free(frame->adata,frame->asize);
    __dest = (uint8_t *)nni_alloc(frame->len);
    frame->adata = __dest;
    if (__dest == (uint8_t *)0x0) {
      frame->asize = 0;
      return 2;
    }
    uVar8 = frame->len;
    frame->asize = uVar8;
    frame->buf = __dest;
  }
  else {
    __dest = frame->buf;
  }
  for (; uVar8 != 0; uVar8 = uVar8 - uVar7) {
    uVar7 = local_38->iov_len;
    if (uVar8 < local_38->iov_len) {
      uVar7 = uVar8;
    }
    memcpy(__dest,local_38->iov_buf,uVar7);
    local_38 = local_38 + 1;
    __dest = __dest + uVar7;
  }
  sVar3 = nni_aio_count(aio);
  if (sVar3 == 0) {
    if (pnStack_40->send_text == true) {
      frame->op = WS_TEXT;
      bVar1 = 1;
    }
    else {
      frame->op = WS_BINARY;
      bVar1 = 2;
    }
  }
  else {
    frame->op = WS_CONT;
    bVar1 = 0;
  }
  frame->head[0] = bVar1;
  frame->hlen = 2;
  if (frame->final == true) {
    frame->head[0] = bVar1 | 0x80;
  }
  uVar8 = frame->len;
  uVar2 = (uint8_t)uVar8;
  if (uVar8 < 0x7e) {
    frame->head[1] = uVar2;
  }
  else {
    uVar4 = (uint8_t)(uVar8 >> 8);
    if (uVar8 < 0x10000) {
      frame->head[1] = '~';
      frame->head[2] = uVar4;
      frame->head[3] = uVar2;
      frame->hlen = 4;
    }
    else {
      frame->head[1] = '\x7f';
      frame->head[2] = (uint8_t)(uVar8 >> 0x38);
      frame->head[3] = (uint8_t)(uVar8 >> 0x30);
      frame->head[4] = (uint8_t)(uVar8 >> 0x28);
      frame->head[5] = (uint8_t)(uVar8 >> 0x20);
      frame->head[6] = (uint8_t)(uVar8 >> 0x18);
      frame->head[7] = (uint8_t)(uVar8 >> 0x10);
      frame->head[8] = uVar4;
      frame->head[9] = uVar2;
      frame->hlen = 10;
    }
  }
  frame->masked = false;
  if (pnStack_40->server == false) {
    ws_mask_frame(frame);
  }
  return 0;
}

Assistant:

static int
ws_frame_prep_tx(nni_ws *ws, ws_frame *frame)
{
	nng_aio *aio = frame->aio;
	nni_iov *iov;
	unsigned niov;
	size_t   len;
	uint8_t *buf;

	// Figure out how much we need for the entire aio.
	frame->len = 0;
	nni_aio_get_iov(aio, &niov, &iov);
	for (unsigned i = 0; i < niov; i++) {
		frame->len += iov[i].iov_len;
	}

	if ((frame->len > ws->fragsize) && (ws->fragsize > 0)) {
		// Limit it to a single frame per policy (fragsize), as needed.
		frame->len = ws->fragsize;
		// For stream mode, we constrain ourselves to one frame
		// per message. Submitter may see a partial transmit, and
		// should resubmit as needed.  For message mode, we will
		// continue to resubmit.
		frame->final = ws->isstream ? true : false;
	} else {
		// It all fits in this frame (which might not be the first),
		// so we're done.
		frame->final = true;
	}
	// Potentially allocate space for the data if we need to.
	// Note that an empty message is legal.
	if ((frame->asize < frame->len) && (frame->len > 0)) {
		nni_free(frame->adata, frame->asize);
		frame->adata = nni_alloc(frame->len);
		if (frame->adata == NULL) {
			frame->asize = 0;
			return (NNG_ENOMEM);
		}
		frame->asize = frame->len;
		frame->buf   = frame->adata;
	}
	buf = frame->buf;

	// Now copy the data into the frame.
	len = frame->len;
	while (len != 0) {
		size_t n = len;
		if (n > iov->iov_len) {
			n = iov->iov_len;
		}
		memcpy(buf, iov->iov_buf, n);
		iov++;
		len -= n;
		buf += n;
	}

	if (nni_aio_count(aio) == 0) {
		// This is the first frame.
		if (ws->send_text) {
			frame->op = WS_TEXT;
		} else {
			frame->op = WS_BINARY;
		}
	} else {
		frame->op = WS_CONT;
	}

	// Populate the frame header.
	frame->head[0] = frame->op;
	frame->hlen    = 2;
	if (frame->final) {
		frame->head[0] |= 0x80; // final frame bit
	}
	if (frame->len < 126) {
		frame->head[1] = frame->len & 0x7f;
	} else if (frame->len < 65536) {
		frame->head[1] = 126;
		NNI_PUT16(frame->head + 2, (frame->len & 0xffff));
		frame->hlen += 2;
	} else {
		frame->head[1] = 127;
		NNI_PUT64(frame->head + 2, (uint64_t) frame->len);
		frame->hlen += 8;
	}

	// If we are on the client, then we need to mask the frame.
	frame->masked = false;
	if (!ws->server) {
		ws_mask_frame(frame);
	}
	return (0);
}